

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall
YAJLScan::MCU::MCU(MCU *this,bitio_stream *bstream,YAJLTables *tables,YAJLScanHeaderSpec *spec)

{
  YAJLEntropyTable (*paYVar1) [2];
  YAJLEntropyTable *pYVar2;
  u16 uVar3;
  i16 iVar4;
  YAJLEntropyTable ac_table;
  YAJLEntropyTable dc_table;
  YAJLEntropyTable local_58;
  YAJLEntropyTable local_38;
  
  this->xcof[0x38] = 0;
  this->xcof[0x39] = 0;
  this->xcof[0x3a] = 0;
  this->xcof[0x3b] = 0;
  this->xcof[0x3c] = 0;
  this->xcof[0x3d] = 0;
  this->xcof[0x3e] = 0;
  this->xcof[0x3f] = 0;
  this->xcof[0x30] = 0;
  this->xcof[0x31] = 0;
  this->xcof[0x32] = 0;
  this->xcof[0x33] = 0;
  this->xcof[0x34] = 0;
  this->xcof[0x35] = 0;
  this->xcof[0x36] = 0;
  this->xcof[0x37] = 0;
  this->xcof[0x28] = 0;
  this->xcof[0x29] = 0;
  this->xcof[0x2a] = 0;
  this->xcof[0x2b] = 0;
  this->xcof[0x2c] = 0;
  this->xcof[0x2d] = 0;
  this->xcof[0x2e] = 0;
  this->xcof[0x2f] = 0;
  this->xcof[0x20] = 0;
  this->xcof[0x21] = 0;
  this->xcof[0x22] = 0;
  this->xcof[0x23] = 0;
  this->xcof[0x24] = 0;
  this->xcof[0x25] = 0;
  this->xcof[0x26] = 0;
  this->xcof[0x27] = 0;
  this->xcof[0x18] = 0;
  this->xcof[0x19] = 0;
  this->xcof[0x1a] = 0;
  this->xcof[0x1b] = 0;
  this->xcof[0x1c] = 0;
  this->xcof[0x1d] = 0;
  this->xcof[0x1e] = 0;
  this->xcof[0x1f] = 0;
  this->xcof[0x10] = 0;
  this->xcof[0x11] = 0;
  this->xcof[0x12] = 0;
  this->xcof[0x13] = 0;
  this->xcof[0x14] = 0;
  this->xcof[0x15] = 0;
  this->xcof[0x16] = 0;
  this->xcof[0x17] = 0;
  this->xcof[8] = 0;
  this->xcof[9] = 0;
  this->xcof[10] = 0;
  this->xcof[0xb] = 0;
  this->xcof[0xc] = 0;
  this->xcof[0xd] = 0;
  this->xcof[0xe] = 0;
  this->xcof[0xf] = 0;
  this->xcof[0] = 0;
  this->xcof[1] = 0;
  this->xcof[2] = 0;
  this->xcof[3] = 0;
  this->xcof[4] = 0;
  this->xcof[5] = 0;
  this->xcof[6] = 0;
  this->xcof[7] = 0;
  this->component_id = spec->component_selector + 0xff;
  local_38.arithmetic_table = tables->etables[spec->dc_selector][0].arithmetic_table;
  paYVar1 = tables->etables + spec->dc_selector;
  local_38.marker = ((YAJLEntropyTable *)((long)paYVar1 + 0))->marker;
  local_38._2_6_ = *(undefined6 *)&((YAJLEntropyTable *)((long)paYVar1 + 0))->field_0x2;
  local_38.huffman_table = (*paYVar1)[0].huffman_table;
  local_58.arithmetic_table = tables->etables[spec->ac_selector][1].arithmetic_table;
  pYVar2 = tables->etables[spec->ac_selector];
  local_58.marker = pYVar2[1].marker;
  local_58._2_6_ = *(undefined6 *)&pYVar2[1].field_0x2;
  local_58.huffman_table = pYVar2[1].huffman_table;
  uVar3 = YAJLEntropyTable::decode(&local_38);
  iVar4 = extract_xv(this,bstream,(u8)uVar3);
  this->xcof[0] = iVar4;
  fill_xac(this,bstream,&local_58);
  return;
}

Assistant:

YAJLScan::MCU::MCU(bitio::bitio_stream *bstream, YAJLTables *tables, YAJLScanHeaderSpec *spec) : MCU() {
    component_id = spec->component_selector - 1;
    auto dc_table = tables->etables[spec->dc_selector][0];
    auto ac_table = tables->etables[spec->ac_selector][1];
    u8 ebits = dc_table.decode();
    xcof[0] = extract_xv(bstream, ebits);
    fill_xac(bstream, &ac_table);
}